

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidBuildContentModel(xmlValidCtxtPtr ctxt,xmlElementPtr elem)

{
  int iVar1;
  xmlAutomataPtr am;
  xmlAutomataStatePtr pxVar2;
  _xmlRegexp *comp;
  char expr [5000];
  
  iVar1 = 0;
  if (((elem != (xmlElementPtr)0x0 && ctxt != (xmlValidCtxtPtr)0x0) &&
      (elem->type == XML_ELEMENT_DECL)) && (iVar1 = 1, elem->etype == XML_ELEMENT_TYPE_ELEMENT)) {
    if (elem->contModel == (xmlRegexpPtr)0x0) {
      am = xmlNewAutomata();
      ctxt->am = am;
      if (am == (xmlAutomataPtr)0x0) {
        xmlErrValidNode(ctxt,(xmlNodePtr)elem,XML_ERR_INTERNAL_ERROR,
                        "Cannot create automata for element %s\n",elem->name,(xmlChar *)0x0,
                        (xmlChar *)0x0);
        return 0;
      }
      pxVar2 = xmlAutomataGetInitState(am);
      ctxt->state = pxVar2;
      xmlValidBuildAContentModel(elem->content,ctxt,elem->name);
      xmlAutomataSetFinalState(ctxt->am,ctxt->state);
      comp = xmlAutomataCompile(ctxt->am);
      elem->contModel = comp;
      iVar1 = xmlRegexpIsDeterminist(comp);
      if (iVar1 == 1) {
        ctxt->state = (xmlAutomataStatePtr)0x0;
        xmlFreeAutomata(ctxt->am);
        ctxt->am = (xmlAutomataPtr)0x0;
        return 1;
      }
      expr[0] = '\0';
      xmlSnprintfElementContent(expr,5000,elem->content,1);
      xmlErrValidNode(ctxt,(xmlNodePtr)elem,XML_DTD_CONTENT_NOT_DETERMINIST,
                      "Content model of %s is not deterministic: %s\n",elem->name,(xmlChar *)expr,
                      (xmlChar *)0x0);
      ctxt->valid = 0;
      ctxt->state = (xmlAutomataStatePtr)0x0;
      xmlFreeAutomata(ctxt->am);
      ctxt->am = (xmlAutomataPtr)0x0;
    }
    else {
      iVar1 = xmlRegexpIsDeterminist(elem->contModel);
      if (iVar1 != 0) {
        return 1;
      }
      ctxt->valid = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlValidBuildContentModel(xmlValidCtxtPtr ctxt, xmlElementPtr elem) {

    if ((ctxt == NULL) || (elem == NULL))
	return(0);
    if (elem->type != XML_ELEMENT_DECL)
	return(0);
    if (elem->etype != XML_ELEMENT_TYPE_ELEMENT)
	return(1);
    /* TODO: should we rebuild in this case ? */
    if (elem->contModel != NULL) {
	if (!xmlRegexpIsDeterminist(elem->contModel)) {
	    ctxt->valid = 0;
	    return(0);
	}
	return(1);
    }

    ctxt->am = xmlNewAutomata();
    if (ctxt->am == NULL) {
	xmlErrValidNode(ctxt, (xmlNodePtr) elem,
	                XML_ERR_INTERNAL_ERROR,
	                "Cannot create automata for element %s\n",
		        elem->name, NULL, NULL);
	return(0);
    }
    ctxt->state = xmlAutomataGetInitState(ctxt->am);
    xmlValidBuildAContentModel(elem->content, ctxt, elem->name);
    xmlAutomataSetFinalState(ctxt->am, ctxt->state);
    elem->contModel = xmlAutomataCompile(ctxt->am);
    if (xmlRegexpIsDeterminist(elem->contModel) != 1) {
	char expr[5000];
	expr[0] = 0;
	xmlSnprintfElementContent(expr, 5000, elem->content, 1);
	xmlErrValidNode(ctxt, (xmlNodePtr) elem,
	                XML_DTD_CONTENT_NOT_DETERMINIST,
	       "Content model of %s is not deterministic: %s\n",
	       elem->name, BAD_CAST expr, NULL);
#ifdef DEBUG_REGEXP_ALGO
        xmlRegexpPrint(stderr, elem->contModel);
#endif
        ctxt->valid = 0;
	ctxt->state = NULL;
	xmlFreeAutomata(ctxt->am);
	ctxt->am = NULL;
	return(0);
    }
    ctxt->state = NULL;
    xmlFreeAutomata(ctxt->am);
    ctxt->am = NULL;
    return(1);
}